

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::GetOverlapSegment
               (IntPoint pt1a,IntPoint pt1b,IntPoint pt2a,IntPoint pt2b,IntPoint *pt1,IntPoint *pt2)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = pt2a.Y;
  lVar9 = pt2a.X;
  lVar7 = pt1a.Y;
  lVar8 = pt1a.X;
  lVar3 = pt1b.Y;
  lVar4 = pt1b.X;
  if (lVar7 - lVar3 != 0) {
    uVar1 = (lVar8 - lVar4) / (lVar7 - lVar3);
    uVar5 = -uVar1;
    if (0 < (long)uVar1) {
      uVar5 = uVar1;
    }
    if (uVar5 < 2) {
      lVar2 = lVar7;
      lVar6 = lVar8;
      if (lVar7 < lVar3) {
        lVar2 = lVar3;
        lVar6 = lVar4;
        lVar3 = lVar7;
        lVar4 = lVar8;
      }
      lVar8 = lVar10;
      lVar7 = lVar9;
      if (lVar10 < pt2b.Y) {
        lVar8 = pt2b.Y;
        lVar7 = pt2b.X;
        pt2b.X = lVar9;
        pt2b.Y = lVar10;
      }
      if (lVar2 < lVar8) {
        lVar8 = lVar2;
        lVar7 = lVar6;
      }
      pt1->X = lVar7;
      pt1->Y = lVar8;
      if (pt2b.Y < lVar3) {
        pt2->X = lVar4;
        pt2->Y = lVar3;
      }
      else {
        pt2->X = pt2b.X;
        pt2->Y = pt2b.Y;
        lVar3 = pt2->Y;
      }
      return lVar3 < pt1->Y;
    }
  }
  lVar2 = lVar7;
  lVar6 = lVar8;
  if (lVar4 < lVar8) {
    lVar2 = lVar3;
    lVar6 = lVar4;
    lVar3 = lVar7;
    lVar4 = lVar8;
  }
  lVar7 = lVar9;
  lVar8 = lVar10;
  if (pt2b.X < lVar9) {
    lVar7 = pt2b.X;
    lVar8 = pt2b.Y;
    pt2b.X = lVar9;
    pt2b.Y = lVar10;
  }
  if (lVar7 < lVar6) {
    lVar8 = lVar2;
    lVar7 = lVar6;
  }
  pt1->X = lVar7;
  pt1->Y = lVar8;
  if (lVar4 < pt2b.X) {
    pt2->X = lVar4;
    pt2->Y = lVar3;
  }
  else {
    pt2->X = pt2b.X;
    pt2->Y = pt2b.Y;
    lVar4 = pt2->X;
  }
  return pt1->X < lVar4;
}

Assistant:

bool GetOverlapSegment(IntPoint pt1a, IntPoint pt1b, IntPoint pt2a,
  IntPoint pt2b, IntPoint &pt1, IntPoint &pt2)
{
  //precondition: segments are colinear.
  if ( pt1a.Y == pt1b.Y || Abs((pt1a.X - pt1b.X)/(pt1a.Y - pt1b.Y)) > 1 )
  {
    if (pt1a.X > pt1b.X) SwapPoints(pt1a, pt1b);
    if (pt2a.X > pt2b.X) SwapPoints(pt2a, pt2b);
    if (pt1a.X > pt2a.X) pt1 = pt1a; else pt1 = pt2a;
    if (pt1b.X < pt2b.X) pt2 = pt1b; else pt2 = pt2b;
    return pt1.X < pt2.X;
  } else
  {
    if (pt1a.Y < pt1b.Y) SwapPoints(pt1a, pt1b);
    if (pt2a.Y < pt2b.Y) SwapPoints(pt2a, pt2b);
    if (pt1a.Y < pt2a.Y) pt1 = pt1a; else pt1 = pt2a;
    if (pt1b.Y > pt2b.Y) pt2 = pt1b; else pt2 = pt2b;
    return pt1.Y > pt2.Y;
  }
}